

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_ComputeInnerForcing
              (ARKodeMem ark_mem,ARKodeMRIStepMem step_mem,int stage,sunrealtype cdiff)

{
  uint uVar1;
  int iVar2;
  sunrealtype *psVar3;
  N_Vector *pp_Var4;
  MRIStepCoupling pMVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  double dVar11;
  
  psVar3 = step_mem->cvals;
  pp_Var4 = step_mem->Xvecs;
  uVar6 = 0;
  uVar10 = 0;
  if (0 < stage) {
    uVar10 = (ulong)(uint)stage;
  }
  iVar8 = 0;
  for (; uVar10 != uVar6; uVar6 = uVar6 + 1) {
    if ((step_mem->explicit_rhs != 0) && (-1 < (long)step_mem->stage_map[uVar6])) {
      pp_Var4[iVar8] = step_mem->Fse[step_mem->stage_map[uVar6]];
      iVar8 = iVar8 + 1;
    }
    if ((step_mem->implicit_rhs != 0) && (-1 < (long)step_mem->stage_map[uVar6])) {
      pp_Var4[iVar8] = step_mem->Fsi[step_mem->stage_map[uVar6]];
      iVar8 = iVar8 + 1;
    }
  }
  uVar1 = step_mem->MRIC->nmat;
  dVar11 = 1.0 / cdiff;
  uVar6 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar6 = 0;
  }
  uVar9 = 0;
  do {
    if (uVar9 == uVar6) {
      return 0;
    }
    iVar8 = 0;
    for (uVar7 = 0; uVar10 != uVar7; uVar7 = uVar7 + 1) {
      if (-1 < step_mem->stage_map[uVar7]) {
        if (step_mem->explicit_rhs == 0) {
          psVar3[iVar8] = step_mem->MRIC->G[uVar9][stage][uVar7] * dVar11;
        }
        else {
          iVar2 = step_mem->implicit_rhs;
          pMVar5 = step_mem->MRIC;
          psVar3[iVar8] = pMVar5->W[uVar9][stage][uVar7] * dVar11;
          if (iVar2 != 0) {
            psVar3[(long)iVar8 + 1] = pMVar5->G[uVar9][stage][uVar7] * dVar11;
            iVar8 = iVar8 + 2;
            goto LAB_00142c12;
          }
        }
        iVar8 = iVar8 + 1;
      }
LAB_00142c12:
    }
    iVar8 = N_VLinearCombination(iVar8,psVar3,pp_Var4,step_mem->stepper->forcing[uVar9]);
    uVar9 = uVar9 + 1;
    if (iVar8 != 0) {
      return -0x1c;
    }
  } while( true );
}

Assistant:

int mriStep_ComputeInnerForcing(SUNDIALS_MAYBE_UNUSED ARKodeMem ark_mem,
                                ARKodeMRIStepMem step_mem, int stage,
                                sunrealtype cdiff)
{
  sunrealtype rcdiff;
  int j, k, nmat, nstore, retval;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* compute inner forcing vectors (assumes cdiff != 0) */
  nstore = 0;
  for (j = 0; j < stage; j++)
  {
    if (step_mem->explicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fse[step_mem->stage_map[j]];
      nstore += 1;
    }
    if (step_mem->implicit_rhs && step_mem->stage_map[j] > -1)
    {
      Xvecs[nstore] = step_mem->Fsi[step_mem->stage_map[j]];
      nstore += 1;
    }
  }

  nmat   = step_mem->MRIC->nmat;
  rcdiff = ONE / cdiff;

  for (k = 0; k < nmat; k++)
  {
    nstore = 0;
    for (j = 0; j < stage; j++)
    {
      if (step_mem->stage_map[j] > -1)
      {
        if (step_mem->explicit_rhs && step_mem->implicit_rhs)
        {
          /* ImEx */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
        else if (step_mem->explicit_rhs)
        {
          /* explicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->W[k][stage][j];
          nstore += 1;
        }
        else
        {
          /* implicit only */
          cvals[nstore] = rcdiff * step_mem->MRIC->G[k][stage][j];
          nstore += 1;
        }
      }
    }

    retval = N_VLinearCombination(nstore, cvals, Xvecs,
                                  step_mem->stepper->forcing[k]);
    if (retval != 0) { return (ARK_VECTOROP_ERR); }
  }

#ifdef SUNDIALS_LOGGING_EXTRA_DEBUG
  for (k = 0; k < nmat; k++)
  {
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_DEBUG,
                       "ARKODE::mriStep_ComputeInnerForcing", "forcing",
                       "forcing_%i(:) =", k);
    N_VPrintFile(step_mem->stepper->forcing[k], ARK_LOGGER->debug_fp);
  }
#endif

  return (ARK_SUCCESS);
}